

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLNodeAdapter.cxx
# Opt level: O2

optional<XMLNodeAdapter> *
getTopNodeFromFile(optional<XMLNodeAdapter> *__return_storage_ptr__,string_view fileName,
                  string_view topNodeName)

{
  char cVar1;
  XMLNode node;
  XMLNode local_40;
  XMLNode local_38;
  XMLNodeAdapter local_30;
  
  XMLParser::XMLNode::openFileHelperThrows(&local_40,fileName._M_str,topNodeName._M_str);
  cVar1 = XMLParser::XMLNode::isEmpty(&local_40);
  if (cVar1 == '\0') {
    XMLParser::XMLNode::XMLNode(&local_38,&local_40);
    XMLNodeAdapter::XMLNodeAdapter(&local_30,&local_38);
    std::optional<XMLNodeAdapter>::optional<XMLNodeAdapter,_true>(__return_storage_ptr__,&local_30);
    XMLNodeAdapter::~XMLNodeAdapter(&local_30);
    XMLParser::XMLNode::~XMLNode(&local_38);
    XMLParser::XMLNode::~XMLNode(&local_40);
  }
  else {
    XMLParser::XMLNode::~XMLNode(&local_40);
    (__return_storage_ptr__->super__Optional_base<XMLNodeAdapter,_false,_false>)._M_payload.
    super__Optional_payload<XMLNodeAdapter,_true,_false,_false>.
    super__Optional_payload_base<XMLNodeAdapter>._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<XMLNodeAdapter> getTopNodeFromFile(std::string_view fileName,
                                                 std::string_view topNodeName)
{
    try
    {
        auto node = XMLParser::XMLNode::openFileHelperThrows(fileName.data(), topNodeName.data());
        if(!node.isEmpty())
        {
            return XMLNodeAdapter(node);
        }
    }
    catch(const std::exception &)
    {
        // No need to log message for now. Empty optional will be returned indicating failure.
    }
    // Return empty optional if node is empty or an exception occurred
    return std::nullopt;
}